

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture2.c
# Opt level: O3

ktx_error_code_e
ktxTexture2_inflateZstdInt
          (ktxTexture2 *This,ktx_uint8_t *pDeflatedData,ktx_uint8_t *pInflatedData,
          ktx_size_t inflatedDataCapacity)

{
  ktxLevelIndexEntry *__dest;
  ktxTexture2_private *pkVar1;
  ktx_uint32_t kVar2;
  uint uVar3;
  ZSTD_ErrorCode ZVar4;
  void *__src;
  ZSTD_DCtx *dctx;
  size_t code;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong __size;
  ktx_size_t kVar8;
  long lVar9;
  ktx_error_code_e kVar10;
  undefined1 auVar11 [16];
  
  kVar10 = KTX_INVALID_VALUE;
  if ((pInflatedData != (ktx_uint8_t *)0x0 && pDeflatedData != (ktx_uint8_t *)0x0) &&
     (kVar10 = KTX_INVALID_OPERATION, This->supercompressionScheme == KTX_SS_ZSTD)) {
    pkVar1 = This->_private;
    __size = (ulong)(This->numLevels * 0x18);
    __src = malloc(__size);
    if (__src == (void *)0x0) {
      kVar10 = KTX_OUT_OF_MEMORY;
    }
    else {
      kVar2 = ktxTexture2_calcPostInflationLevelAlignment(This);
      dctx = ZSTD_createDCtx();
      kVar10 = KTX_OUT_OF_MEMORY;
      if (dctx != (ZSTD_DCtx *)0x0) {
        __dest = pkVar1->_levelIndex;
        uVar7 = (ulong)This->numLevels;
        if ((int)(This->numLevels - 1) < 0) {
          kVar8 = 0;
        }
        else {
          lVar9 = 0;
          kVar8 = 0;
          do {
            uVar6 = (int)uVar7 - 1;
            uVar7 = (ulong)uVar6;
            code = ZSTD_decompressDCtx(dctx,pInflatedData + lVar9,inflatedDataCapacity,
                                       pDeflatedData + __dest[uVar7].byteOffset,
                                       pkVar1->_levelIndex[uVar7].byteLength);
            uVar3 = ZSTD_isError(code);
            if (uVar3 != 0) {
              ZVar4 = ZSTD_getErrorCode(code);
              if (ZVar4 == ZSTD_error_dstSize_tooSmall) {
LAB_001eb11b:
                kVar10 = KTX_DECOMPRESS_LENGTH_ERROR;
              }
              else if (ZVar4 == ZSTD_error_memory_allocation) {
                kVar10 = KTX_OUT_OF_MEMORY;
              }
              else if (ZVar4 == ZSTD_error_checksum_wrong) {
                kVar10 = KTX_DECOMPRESS_CHECKSUM_ERROR;
              }
              else {
                kVar10 = KTX_FILE_DATA_ERROR;
              }
              goto LAB_001eb125;
            }
            if (This->_private->_levelIndex[uVar7].uncompressedByteLength != code)
            goto LAB_001eb11b;
            *(long *)((long)__src + uVar7 * 0x18) = lVar9;
            *(size_t *)((long)__src + uVar7 * 0x18 + 8) = code;
            *(size_t *)((long)__src + uVar7 * 0x18 + 0x10) = code;
            auVar11 = ZEXT416((uint)((float)code / (float)kVar2));
            auVar11 = roundss(auVar11,auVar11,10);
            uVar5 = (long)(auVar11._0_4_ * (float)kVar2) & 0xffffffff;
            kVar8 = kVar8 + uVar5;
            lVar9 = lVar9 + uVar5;
            inflatedDataCapacity = inflatedDataCapacity - uVar5;
          } while (0 < (int)uVar6);
        }
        This->dataSize = kVar8;
        This->supercompressionScheme = KTX_SS_BEGIN_RANGE;
        memcpy(__dest,__src,__size);
        This->_private->_requiredLevelAlignment = kVar2;
        kVar10 = KTX_SUCCESS;
      }
LAB_001eb125:
      ZSTD_freeDCtx(dctx);
      free(__src);
    }
  }
  return kVar10;
}

Assistant:

KTX_error_code
ktxTexture2_inflateZstdInt(ktxTexture2* This, ktx_uint8_t* pDeflatedData,
                           ktx_uint8_t* pInflatedData,
                           ktx_size_t inflatedDataCapacity)
{
    ktx_uint32_t levelIndexByteLength =
                            This->numLevels * sizeof(ktxLevelIndexEntry);
    uint64_t levelOffset = 0;
    ktxLevelIndexEntry* cindex = This->_private->_levelIndex;
    ktxLevelIndexEntry* nindex = NULL;
    ktx_uint32_t uncompressedLevelAlignment;
    ktx_error_code_e result = KTX_SUCCESS;

    ZSTD_DCtx* dctx = NULL;

    if (pDeflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (pInflatedData == NULL)
        return KTX_INVALID_VALUE;

    if (This->supercompressionScheme != KTX_SS_ZSTD)
        return KTX_INVALID_OPERATION;

    nindex = malloc(levelIndexByteLength);
    if (nindex == NULL)
        return KTX_OUT_OF_MEMORY;

    uncompressedLevelAlignment =
        ktxTexture2_calcPostInflationLevelAlignment(This);

    ktx_size_t inflatedByteLength = 0;
    dctx = ZSTD_createDCtx();
    if (dctx == NULL) {
        result = KTX_OUT_OF_MEMORY;
        goto cleanup;
    }
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        size_t levelByteLength =
            ZSTD_decompressDCtx(dctx, pInflatedData + levelOffset,
                              inflatedDataCapacity,
                              &pDeflatedData[cindex[level].byteOffset],
                              cindex[level].byteLength);
        if (ZSTD_isError(levelByteLength)) {
            ZSTD_ErrorCode error = ZSTD_getErrorCode(levelByteLength);
            switch(error) {
              case ZSTD_error_dstSize_tooSmall:
                result = KTX_DECOMPRESS_LENGTH_ERROR; // inflatedDataCapacity too small.
                goto cleanup;
              case ZSTD_error_checksum_wrong:
                result = KTX_DECOMPRESS_CHECKSUM_ERROR;
                goto cleanup;
              case ZSTD_error_memory_allocation:
                result =  KTX_OUT_OF_MEMORY;
                goto cleanup;
             default:
                result = KTX_FILE_DATA_ERROR;
                goto cleanup;
            }
        }

        if (This->_private->_levelIndex[level].uncompressedByteLength != levelByteLength) {
            result = KTX_DECOMPRESS_LENGTH_ERROR;
            goto cleanup;
        }

        nindex[level].byteOffset = levelOffset;
        nindex[level].uncompressedByteLength = nindex[level].byteLength =
                                                            levelByteLength;
        ktx_size_t paddedLevelByteLength
              = _KTX_PADN(uncompressedLevelAlignment, levelByteLength);
        inflatedByteLength += paddedLevelByteLength;
        levelOffset += paddedLevelByteLength;
        inflatedDataCapacity -= paddedLevelByteLength;
    }

    // Now modify the texture.

    This->dataSize = inflatedByteLength;
    This->supercompressionScheme = KTX_SS_NONE;
    memcpy(cindex, nindex, levelIndexByteLength); // Update level index
    This->_private->_requiredLevelAlignment = uncompressedLevelAlignment;

cleanup:
    ZSTD_freeDCtx(dctx);
    free(nindex);
    return result;
}